

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

Move<vk::Handle<(vk::HandleType)7>_> *
vkt::api::anon_unknown_1::DeviceMemory::create
          (Move<vk::Handle<(vk::HandleType)7>_> *__return_storage_ptr__,Environment *env,
          Resources *param_2,Parameters *params)

{
  VkMemoryAllocateInfo allocInfo;
  VkMemoryAllocateInfo local_28;
  
  local_28.sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
  local_28.pNext = (void *)0x0;
  local_28.allocationSize = *(VkDeviceSize *)param_2;
  local_28.memoryTypeIndex = *(deUint32 *)(param_2 + 8);
  ::vk::allocateMemory
            (__return_storage_ptr__,env->vkd,env->device,&local_28,env->allocationCallbacks);
  return __return_storage_ptr__;
}

Assistant:

static Move<VkDeviceMemory> create (const Environment& env, const Resources&, const Parameters& params)
	{
		const VkMemoryAllocateInfo	allocInfo	=
		{
			VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO,
			DE_NULL,
			params.size,
			params.memoryTypeIndex
		};

		return allocateMemory(env.vkd, env.device, &allocInfo, env.allocationCallbacks);
	}